

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

int xpathCommonTest(char *filename,char *result,int xptr,int expr)

{
  code *pcVar1;
  int iVar2;
  char *__filename;
  FILE *__stream;
  char *pcVar3;
  size_t sVar4;
  undefined8 *puVar5;
  ulong uVar6;
  int iVar7;
  undefined8 local_13c0;
  char expression [5000];
  
  __filename = resultFilename(filename,temp_directory,".res");
  if (__filename == (char *)0x0) {
    fwrite("Out of memory\n",0xe,1,_stderr);
    fatalError();
  }
  xpathOutput = (FILE *)fopen64(__filename,"wb");
  if ((FILE *)xpathOutput == (FILE *)0x0) {
    fprintf(_stderr,"failed to open output file %s\n",__filename);
  }
  else {
    local_13c0 = result;
    __stream = fopen64(filename,"rb");
    if (__stream != (FILE *)0x0) {
LAB_00109dcc:
      do {
        pcVar3 = fgets(expression,0x1194,__stream);
        if (pcVar3 == (char *)0x0) {
          fclose(__stream);
          fclose((FILE *)xpathOutput);
          pcVar3 = local_13c0;
          iVar7 = 0;
          if ((local_13c0 != (char *)0x0) &&
             (iVar2 = compareFiles(__filename,local_13c0), iVar2 != 0)) {
            fprintf(_stderr,"Result for %s failed in %s\n",filename,pcVar3);
            iVar7 = iVar2;
          }
          unlink(__filename);
          free(__filename);
          return iVar7;
        }
        sVar4 = strlen(expression);
        pcVar3 = expression + (int)sVar4;
        for (uVar6 = sVar4 & 0xffffffff; 0 < (int)(uint)uVar6; uVar6 = uVar6 - 1) {
          if ((0x20 < (ulong)(byte)expression[uVar6 - 1]) ||
             ((0x100002600U >> ((ulong)(byte)expression[uVar6 - 1] & 0x3f) & 1) == 0)) {
            expression[(uint)uVar6 & 0x7fffffff] = '\0';
            fprintf((FILE *)xpathOutput,"\n========================\nExpression: %s\n",expression);
            testXPath(expression,xptr,expr);
            goto LAB_00109dcc;
          }
          pcVar3 = pcVar3 + -1;
        }
        *pcVar3 = '\0';
      } while( true );
    }
    puVar5 = (undefined8 *)__xmlGenericError();
    pcVar1 = (code *)*puVar5;
    puVar5 = (undefined8 *)__xmlGenericErrorContext();
    (*pcVar1)(*puVar5,"Cannot open %s for reading\n",filename);
  }
  free(__filename);
  return -1;
}

Assistant:

static int
xpathCommonTest(const char *filename, const char *result,
                int xptr, int expr) {
    FILE *input;
    char expression[5000];
    int len, ret = 0;
    char *temp;

    temp = resultFilename(filename, temp_directory, ".res");
    if (temp == NULL) {
        fprintf(stderr, "Out of memory\n");
        fatalError();
    }
    xpathOutput = fopen(temp, "wb");
    if (xpathOutput == NULL) {
	fprintf(stderr, "failed to open output file %s\n", temp);
        free(temp);
	return(-1);
    }

    input = fopen(filename, "rb");
    if (input == NULL) {
        xmlGenericError(xmlGenericErrorContext,
		"Cannot open %s for reading\n", filename);
        free(temp);
	return(-1);
    }
    while (fgets(expression, 4500, input) != NULL) {
	len = strlen(expression);
	len--;
	while ((len >= 0) &&
	       ((expression[len] == '\n') || (expression[len] == '\t') ||
		(expression[len] == '\r') || (expression[len] == ' '))) len--;
	expression[len + 1] = 0;
	if (len >= 0) {
	    fprintf(xpathOutput,
	            "\n========================\nExpression: %s\n",
		    expression) ;
	    testXPath(expression, xptr, expr);
	}
    }

    fclose(input);
    fclose(xpathOutput);
    if (result != NULL) {
	ret = compareFiles(temp, result);
	if (ret) {
	    fprintf(stderr, "Result for %s failed in %s\n", filename, result);
	}
    }

    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }
    return(ret);
}